

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::lazyPrint(ConsoleReporter *this)

{
  if ((this->super_StreamingReporterBase).currentTestRunInfo.used == false) {
    lazyPrintRunInfo(this);
  }
  if ((this->super_StreamingReporterBase).currentGroupInfo.used == false) {
    lazyPrintGroupInfo(this);
  }
  if ((this->super_StreamingReporterBase).field_0x1c9 == '\0') {
    printTestCaseAndSectionHeader(this);
    (this->super_StreamingReporterBase).field_0x1c9 = 1;
  }
  return;
}

Assistant:

void lazyPrint() {

            if( !currentTestRunInfo.used )
                lazyPrintRunInfo();
            if( !currentGroupInfo.used )
                lazyPrintGroupInfo();

            if( !m_headerPrinted ) {
                printTestCaseAndSectionHeader();
                m_headerPrinted = true;
            }
        }